

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O3

void __thiscall
xmrig::HttpContext::HttpContext(HttpContext *this,int parser_type,IHttpListener *listener)

{
  _Rb_tree_header *p_Var1;
  mapped_type *ppHVar2;
  http_parser *phVar3;
  uv_tcp_t *puVar4;
  undefined8 uVar5;
  uint64_t local_30;
  
  local_30 = SEQUENCE;
  SEQUENCE = SEQUENCE + 1;
  (this->super_HttpData).method = 0;
  (this->super_HttpData).status = 0;
  p_Var1 = &(this->super_HttpData).headers._M_t._M_impl.super__Rb_tree_header;
  (this->super_HttpData).headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->super_HttpData).headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_HttpData).headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_HttpData).headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_HttpData).headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_HttpData).body._M_dataplus._M_p = (pointer)&(this->super_HttpData).body.field_2;
  (this->super_HttpData).body._M_string_length = 0;
  (this->super_HttpData).body.field_2._M_local_buf[0] = '\0';
  (this->super_HttpData).url._M_dataplus._M_p = (pointer)&(this->super_HttpData).url.field_2;
  (this->super_HttpData).url._M_string_length = 0;
  (this->super_HttpData).url.field_2._M_local_buf[0] = '\0';
  (this->super_HttpData).m_id = local_30;
  this->_vptr_HttpContext = (_func_int **)&PTR__HttpContext_001aca28;
  this->m_wasHeaderValue = false;
  this->m_listener = listener;
  (this->m_lastHeaderField)._M_dataplus._M_p = (pointer)&(this->m_lastHeaderField).field_2;
  (this->m_lastHeaderField)._M_string_length = 0;
  (this->m_lastHeaderField).field_2._M_local_buf[0] = '\0';
  (this->m_lastHeaderValue)._M_dataplus._M_p = (pointer)&(this->m_lastHeaderValue).field_2;
  (this->m_lastHeaderValue)._M_string_length = 0;
  (this->m_lastHeaderValue).field_2._M_local_buf[0] = '\0';
  ppHVar2 = std::
            map<unsigned_long,_xmrig::HttpContext_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_xmrig::HttpContext_*>_>_>
            ::operator[]((map<unsigned_long,_xmrig::HttpContext_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_xmrig::HttpContext_*>_>_>
                          *)storage,&local_30);
  *ppHVar2 = this;
  phVar3 = (http_parser *)operator_new(0x20);
  this->m_parser = phVar3;
  puVar4 = (uv_tcp_t *)operator_new(0xf8);
  this->m_tcp = puVar4;
  uVar5 = uv_default_loop();
  uv_tcp_init(uVar5,this->m_tcp);
  uv_tcp_nodelay(this->m_tcp,1);
  http_parser_init(this->m_parser,parser_type);
  this->m_tcp->data = this;
  this->m_parser->data = this;
  if (http_settings._56_8_ == 0) {
    http_settings._0_8_ = 0;
    http_settings._16_8_ = 0;
    http_settings._64_8_ = 0;
    http_settings._72_8_ = 0;
    http_settings._8_8_ = attach::anon_class_1_0_00000001::__invoke;
    http_settings._24_8_ = onHeaderField;
    http_settings._32_8_ = onHeaderValue;
    http_settings._40_8_ = attach::anon_class_1_0_00000001::__invoke;
    http_settings._48_8_ = attach::anon_class_1_0_00000001::__invoke;
    http_settings._56_8_ = attach::anon_class_1_0_00000001::__invoke;
  }
  return;
}

Assistant:

xmrig::HttpContext::HttpContext(int parser_type, IHttpListener *listener) :
    HttpData(SEQUENCE++),
    m_wasHeaderValue(false),
    m_listener(listener)
{
    storage[id()] = this;

    m_parser = new http_parser;
    m_tcp    = new uv_tcp_t;

    uv_tcp_init(uv_default_loop(), m_tcp);
    uv_tcp_nodelay(m_tcp, 1);

    http_parser_init(m_parser, static_cast<http_parser_type>(parser_type));

    m_parser->data = m_tcp->data = this;

    if (http_settings.on_message_complete == nullptr) {
        attach(&http_settings);
    }
}